

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::convert_double_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  bool bVar1;
  char cVar2;
  uint64_t uVar3;
  runtime_error *prVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  char *comment;
  char print_buffer [64];
  string *ts_5;
  char *local_3b0;
  uint local_3a4;
  double local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  string local_378 [2];
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  string local_310;
  string local_2f0;
  undefined1 *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [32];
  undefined1 *local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined1 local_280 [8];
  undefined4 local_278;
  undefined1 local_274;
  undefined1 local_273;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined4 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined1 local_240 [32];
  undefined1 *local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined1 local_208 [32];
  undefined7 local_1e8;
  undefined4 uStack_1e1;
  undefined8 local_1dc;
  undefined8 uStack_1d4;
  undefined4 local_1cc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1c8;
  undefined **local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined1 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined1 local_158 [32];
  undefined1 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 local_120 [8];
  undefined4 local_118;
  undefined1 local_114;
  undefined1 local_113;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 auStack_e0 [32];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 auStack_a8 [32];
  undefined7 local_88;
  undefined4 uStack_81;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_3a0 = (c->m).c[col].r[row].f64;
  if ((!NAN(local_3a0) && !NAN(local_3a0)) && ABS(local_3a0) != INFINITY) {
    format_double_abi_cxx11_(&local_2f0,this,local_3a0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((this->backend).double_literal_suffix != true) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  bVar1 = (this->options).es;
  local_3a4 = (this->options).version;
  uVar7 = 0x81;
  if (bVar1 != false) {
    uVar7 = 299;
  }
  if (uVar7 < local_3a4) {
    local_2d0 = local_2b8;
    local_2f0._M_string_length._0_4_ = 0;
    local_2f0._M_dataplus._M_p = (pointer)&PTR__SPIRType_0035c188;
    local_2f0._M_string_length._4_4_ = 0x16;
    local_2f0.field_2._12_4_ = 1;
    local_2c8 = 0;
    local_2c0 = 8;
    local_298 = local_280;
    local_290 = 0;
    local_288 = 8;
    local_278 = 0;
    local_274 = 0;
    local_273 = 0;
    local_270 = 0;
    uStack_268 = 0;
    local_260 = 8;
    local_380 = local_240;
    local_250 = 0;
    local_248 = 8;
    local_388 = local_208;
    local_218 = 0;
    local_210 = 8;
    local_1e8 = 0;
    uStack_1e1 = 0;
    local_1dc = 0;
    uStack_1d4 = 0;
    local_1cc = 0;
    local_1c8._M_buckets = &local_1c8._M_single_bucket;
    local_170 = local_158;
    local_188 = 0x1500000000;
    local_190 = &PTR__SPIRType_0035c188;
    local_174 = 1;
    local_168 = 0;
    local_160 = 8;
    local_130 = 0;
    local_128 = 8;
    local_118 = 0;
    local_114 = 0;
    local_113 = 0;
    local_110 = 0;
    uStack_108 = 0;
    local_100 = 8;
    local_390 = auStack_e0;
    local_f0 = 0;
    local_e8 = 8;
    local_398 = auStack_a8;
    local_b8 = 0;
    local_b0 = 8;
    local_88 = 0;
    uStack_81 = 0;
    local_6c = 0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_7c = 0;
    uStack_74 = 0;
    local_1c8._M_bucket_count = 1;
    local_1c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1c8._M_element_count = 0;
    local_68._M_bucket_count = 1;
    local_1c8._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_180 = 0x400000000a;
    local_1c8._M_rehash_policy._M_next_resize = 0;
    local_1c8._M_single_bucket = (__node_base_ptr)0x0;
    local_2f0.field_2._M_allocated_capacity._0_4_ = 0xe;
    local_178 = 1;
    local_2f0.field_2._4_8_ = 0x100000040;
    local_258 = local_380;
    local_220 = local_388;
    local_138 = local_120;
    local_f8 = local_390;
    local_c0 = local_398;
    if (local_3a4 < 0x136 && bVar1 == true) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar4,"64-bit integers not supported in ES profile before version 310.");
      *(undefined ***)prVar4 = &PTR__runtime_error_0035bd08;
      __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar3 = (c->m).c[col].r[row].u64;
    local_378[0]._M_dataplus._M_p = (pointer)&local_378[0].field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_378,"GL_ARB_gpu_shader_int64","");
    ts_5 = __return_storage_ptr__;
    require_extension_internal(this,local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378[0]._M_dataplus._M_p != &local_378[0].field_2) {
      operator_delete(local_378[0]._M_dataplus._M_p);
    }
    pcVar6 = "ul";
    if ((this->backend).long_long_literal_suffix != false) {
      pcVar6 = "ull";
    }
    snprintf((char *)local_378,0x40,"0x%llx%s",uVar3,pcVar6);
    local_3b0 = "inf";
    if (-INFINITY < local_3a0) {
      if (NAN(local_3a0)) {
        local_3b0 = "nan";
      }
    }
    else {
      local_3b0 = "-inf";
    }
    (*(this->super_Compiler)._vptr_Compiler[0x3c])(local_330,this,&local_2f0,&local_190);
    join<std::__cxx11::string,char_const(&)[2],char(&)[64],char_const(&)[5],char_const*&,char_const(&)[5]>
              (&local_310,(spirv_cross *)local_330,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d210e,
               (char (*) [2])local_378,(char (*) [64])" /* ",(char (*) [5])&local_3b0,
               (char **)" */)",(char (*) [5])ts_5);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    if (local_330[0] != local_320) {
      operator_delete(local_330[0]);
    }
    local_190 = &PTR__SPIRType_0035c188;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_398) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_390) {
      free(local_f8);
    }
    local_130 = 0;
    if (local_138 != local_120) {
      free(local_138);
    }
    local_168 = 0;
    if (local_170 != local_158) {
      free(local_170);
    }
    local_2f0._M_dataplus._M_p = (pointer)&PTR__SPIRType_0035c188;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1c8);
    local_218 = 0;
    if (local_220 != local_388) {
      free(local_220);
    }
    local_250 = 0;
    if (local_258 != local_380) {
      free(local_258);
    }
    local_290 = 0;
    if (local_298 != local_280) {
      free(local_298);
    }
    local_2c8 = 0;
    if (local_2d0 == local_2b8) {
      return __return_storage_ptr__;
    }
    free(local_2d0);
    return __return_storage_ptr__;
  }
  if (bVar1 != false) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar4,"FP64 not supported in ES profile.");
LAB_0013eb0f:
    *(undefined ***)prVar4 = &PTR__runtime_error_0035bd08;
    __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f0,"GL_ARB_gpu_shader_fp64","");
  require_extension_internal(this,&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if (local_3a0 < INFINITY) {
    if (local_3a0 <= -INFINITY) {
      pcVar6 = "(-1.0 / 0.0)";
      if ((this->backend).double_literal_suffix != false) {
        pcVar6 = "(-1.0lf / 0.0lf)";
      }
      goto LAB_0013ea65;
    }
    if (!NAN(local_3a0)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar4,"Cannot represent non-finite floating point constant.");
      goto LAB_0013eb0f;
    }
    cVar2 = (this->backend).double_literal_suffix;
    pcVar5 = "(0.0lf / 0.0lf)";
    pcVar6 = "(0.0 / 0.0)";
  }
  else {
    cVar2 = (this->backend).double_literal_suffix;
    pcVar5 = "(1.0lf / 0.0lf)";
    pcVar6 = "(1.0 / 0.0)";
  }
  if (cVar2 != '\0') {
    pcVar6 = pcVar5;
  }
LAB_0013ea65:
  ::std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::convert_double_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	double double_value = c.scalar_f64(col, row);

	if (std::isnan(double_value) || std::isinf(double_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type { OpTypeFloat };
			SPIRType in_type { OpTypeInt };
			out_type.basetype = SPIRType::Double;
			in_type.basetype = SPIRType::UInt64;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 64;
			in_type.width = 64;

			uint64_t u64_value = c.scalar_u64(col, row);

			if (options.es && options.version < 310) // GL_NV_gpu_shader5 fallback requires 310.
				SPIRV_CROSS_THROW("64-bit integers not supported in ES profile before version 310.");
			require_extension_internal("GL_ARB_gpu_shader_int64");

			char print_buffer[64];
#ifdef _WIN32
			sprintf(print_buffer, "0x%llx%s", static_cast<unsigned long long>(u64_value),
			        backend.long_long_literal_suffix ? "ull" : "ul");
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%llx%s", static_cast<unsigned long long>(u64_value),
			         backend.long_long_literal_suffix ? "ull" : "ul");
#endif

			const char *comment = "inf";
			if (double_value == -numeric_limits<double>::infinity())
				comment = "-inf";
			else if (std::isnan(double_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");

			if (double_value == numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(1.0lf / 0.0lf)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (double_value == -numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(-1.0lf / 0.0lf)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(double_value))
			{
				if (backend.double_literal_suffix)
					res = "(0.0lf / 0.0lf)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = format_double(double_value);
		if (backend.double_literal_suffix)
			res += "lf";
	}

	return res;
}